

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::Extension::
InternalSerializeMessageSetItemWithCachedSizesToArray
          (Extension *this,int number,bool deterministic,uint8 *target)

{
  LogMessage *other;
  LogFinisher local_8d [13];
  LogMessage local_80;
  uint8 *local_48;
  uint8 *target_local;
  bool deterministic_local;
  Extension *pEStack_38;
  int number_local;
  Extension *this_local;
  uint8 *local_28;
  undefined4 local_1c;
  uint8 *local_18;
  undefined4 local_c;
  
  local_48 = target;
  target_local._3_1_ = deterministic;
  target_local._4_4_ = number;
  pEStack_38 = this;
  if ((this->type == '\v') && ((this->is_repeated & 1U) == 0)) {
    this_local = (Extension *)target;
    if ((this->field_0xa & 1) == 0) {
      local_c = 0xb;
      local_18 = target;
      local_48 = io::CodedOutputStream::WriteVarint32ToArray(0xb,target);
      local_48 = WireFormatLite::WriteUInt32ToArray(2,target_local._4_4_,local_48);
      if (((byte)this->field_0xa >> 4 & 1) == 0) {
        local_48 = WireFormatLite::InternalWriteMessageToArray
                             (3,(this->field_0).message_value,(bool)(target_local._3_1_ & 1),
                              local_48);
      }
      else {
        local_48 = (uint8 *)(**(code **)((((this->field_0).repeated_string_value)->
                                         super_RepeatedPtrFieldBase).arena_ + 0x88))
                                      ((this->field_0).repeated_string_value,3,
                                       target_local._3_1_ & 1,local_48);
      }
      local_1c = 0xc;
      local_28 = local_48;
      this_local = (Extension *)io::CodedOutputStream::WriteVarint32ToArray(0xc,local_48);
    }
  }
  else {
    LogMessage::LogMessage
              (&local_80,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
               ,0x249);
    other = LogMessage::operator<<(&local_80,"Invalid message set extension.");
    LogFinisher::operator=(local_8d,other);
    LogMessage::~LogMessage(&local_80);
    this_local = (Extension *)
                 InternalSerializeFieldWithCachedSizesToArray
                           (this,target_local._4_4_,(bool)(target_local._3_1_ & 1),local_48);
  }
  return (uint8 *)this_local;
}

Assistant:

uint8*
ExtensionSet::Extension::InternalSerializeMessageSetItemWithCachedSizesToArray(
    int number, bool deterministic, uint8* target) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but serialize it the normal way.
    GOOGLE_LOG(WARNING) << "Invalid message set extension.";
    return InternalSerializeFieldWithCachedSizesToArray(number, deterministic,
                                                        target);
  }

  if (is_cleared) return target;

  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, number, target);
  // Write message.
  if (is_lazy) {
    target = lazymessage_value->InternalWriteMessageToArray(
        WireFormatLite::kMessageSetMessageNumber, deterministic, target);
  } else {
    target = WireFormatLite::InternalWriteMessageToArray(
        WireFormatLite::kMessageSetMessageNumber, *message_value, deterministic,
        target);
  }
  // End group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}